

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O1

xmlNodePtr xmlSchemaGetComponentNode(xmlSchemaBasicItemPtr item)

{
  xmlNodePtr pxVar1;
  long lVar2;
  
  pxVar1 = (xmlNodePtr)0x0;
  switch(item->type) {
  case XML_SCHEMA_TYPE_ANY:
  case XML_SCHEMA_TYPE_ANY_ATTRIBUTE:
  case XML_SCHEMA_TYPE_IDC_UNIQUE:
  case XML_SCHEMA_TYPE_IDC_KEY:
  case XML_SCHEMA_TYPE_IDC_KEYREF:
    lVar2 = 0x18;
    break;
  case XML_SCHEMA_TYPE_FACET:
  case XML_SCHEMA_TYPE_SIMPLE_CONTENT:
  case XML_SCHEMA_TYPE_COMPLEX_CONTENT:
  case XML_SCHEMA_TYPE_UR:
  case XML_SCHEMA_TYPE_RESTRICTION:
  case XML_SCHEMA_TYPE_EXTENSION:
  case XML_SCHEMA_TYPE_NOTATION:
  case XML_SCHEMA_TYPE_LIST:
  case XML_SCHEMA_TYPE_UNION:
    goto switchD_00193ca6_caseD_3;
  case XML_SCHEMA_TYPE_SIMPLE:
  case XML_SCHEMA_TYPE_COMPLEX:
  case XML_SCHEMA_TYPE_ELEMENT:
    lVar2 = 0x48;
    break;
  case XML_SCHEMA_TYPE_SEQUENCE:
  case XML_SCHEMA_TYPE_CHOICE:
  case XML_SCHEMA_TYPE_ALL:
    lVar2 = 0x20;
    break;
  case XML_SCHEMA_TYPE_ATTRIBUTE:
    lVar2 = 0x68;
    break;
  case XML_SCHEMA_TYPE_ATTRIBUTEGROUP:
    lVar2 = 0x40;
    break;
  case XML_SCHEMA_TYPE_GROUP:
    lVar2 = 0x30;
    break;
  default:
    if (item->type != XML_SCHEMA_EXTRA_QNAMEREF) {
      return (xmlNodePtr)0x0;
    }
  case XML_SCHEMA_TYPE_PARTICLE:
  case XML_SCHEMA_TYPE_ATTRIBUTE_USE:
    lVar2 = 0x28;
  }
  pxVar1 = *(xmlNodePtr *)((long)&item->type + lVar2);
switchD_00193ca6_caseD_3:
  return pxVar1;
}

Assistant:

static xmlNodePtr
xmlSchemaGetComponentNode(xmlSchemaBasicItemPtr item)
{
    switch (item->type) {
	case XML_SCHEMA_TYPE_ELEMENT:
	    return (((xmlSchemaElementPtr) item)->node);
	case XML_SCHEMA_TYPE_ATTRIBUTE:
	    return (((xmlSchemaAttributePtr) item)->node);
	case XML_SCHEMA_TYPE_COMPLEX:
	case XML_SCHEMA_TYPE_SIMPLE:
	    return (((xmlSchemaTypePtr) item)->node);
	case XML_SCHEMA_TYPE_ANY:
	case XML_SCHEMA_TYPE_ANY_ATTRIBUTE:
	    return (((xmlSchemaWildcardPtr) item)->node);
	case XML_SCHEMA_TYPE_PARTICLE:
	    return (((xmlSchemaParticlePtr) item)->node);
	case XML_SCHEMA_TYPE_SEQUENCE:
	case XML_SCHEMA_TYPE_CHOICE:
	case XML_SCHEMA_TYPE_ALL:
	    return (((xmlSchemaModelGroupPtr) item)->node);
	case XML_SCHEMA_TYPE_GROUP:
	    return (((xmlSchemaModelGroupDefPtr) item)->node);
	case XML_SCHEMA_TYPE_ATTRIBUTEGROUP:
	    return (((xmlSchemaAttributeGroupPtr) item)->node);
	case XML_SCHEMA_TYPE_IDC_UNIQUE:
	case XML_SCHEMA_TYPE_IDC_KEY:
	case XML_SCHEMA_TYPE_IDC_KEYREF:
	    return (((xmlSchemaIDCPtr) item)->node);
	case XML_SCHEMA_EXTRA_QNAMEREF:
	    return(((xmlSchemaQNameRefPtr) item)->node);
	/* TODO: What to do with NOTATIONs?
	case XML_SCHEMA_TYPE_NOTATION:
	    return (((xmlSchemaNotationPtr) item)->node);
	*/
	case XML_SCHEMA_TYPE_ATTRIBUTE_USE:
	    return (((xmlSchemaAttributeUsePtr) item)->node);
	default:
	    return (NULL);
    }
}